

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<bool,_64UL>::resize(SmallVector<bool,_64UL> *this,size_t new_size)

{
  bool *pbVar1;
  ulong uVar2;
  
  if ((this->super_VectorView<bool>).buffer_size < new_size) {
    reserve(this,new_size);
    pbVar1 = (this->super_VectorView<bool>).ptr;
    for (uVar2 = (this->super_VectorView<bool>).buffer_size; uVar2 < new_size; uVar2 = uVar2 + 1) {
      pbVar1[uVar2] = false;
    }
  }
  (this->super_VectorView<bool>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}